

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkRenderPassInputAttachmentAspectCreateInfo *create_info,
          ScratchAllocator *alloc)

{
  void *pvVar1;
  size_t size;
  undefined8 uVar2;
  VkInputAttachmentAspectReference *pVVar3;
  undefined8 *puVar4;
  void *__dest;
  
  puVar4 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x20,0x10);
  if (puVar4 != (undefined8 *)0x0) {
    uVar2 = *(undefined8 *)create_info;
    pvVar1 = create_info->pNext;
    pVVar3 = create_info->pAspectReferences;
    puVar4[2] = *(undefined8 *)&create_info->aspectReferenceCount;
    puVar4[3] = pVVar3;
    *puVar4 = uVar2;
    puVar4[1] = pvVar1;
  }
  if ((ulong)*(uint *)(puVar4 + 2) != 0) {
    pvVar1 = (void *)puVar4[3];
    size = (ulong)*(uint *)(puVar4 + 2) * 0xc;
    __dest = ScratchAllocator::allocate_raw(alloc,size,0x10);
    if (__dest != (void *)0x0) {
      memmove(__dest,pvVar1,size);
      goto LAB_00166fb5;
    }
  }
  __dest = (void *)0x0;
LAB_00166fb5:
  puVar4[3] = __dest;
  return puVar4;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkRenderPassInputAttachmentAspectCreateInfo *create_info,
                                             ScratchAllocator &alloc)
{
	auto *input_att = copy(create_info, 1, alloc);
	input_att->pAspectReferences = copy(input_att->pAspectReferences, input_att->aspectReferenceCount, alloc);
	return input_att;
}